

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::sdivrem(APInt *LHS,APInt *RHS,APInt *Quotient,APInt *Remainder)

{
  bool bVar1;
  bool bVar2;
  APInt local_90;
  APInt local_80;
  APInt local_70;
  APInt local_60;
  APInt local_50;
  APInt local_40;
  
  bVar1 = isNegative(LHS);
  bVar2 = isNegative(RHS);
  if (bVar1) {
    if (bVar2) {
      APInt(&local_40,LHS);
      operator-((llvm *)&local_90,&local_40);
      APInt(&local_60,RHS);
      operator-((llvm *)&local_50,&local_60);
      udivrem(&local_90,&local_50,Quotient,Remainder);
      ~APInt(&local_50);
      ~APInt(&local_60);
      ~APInt(&local_90);
      ~APInt(&local_40);
      Quotient = Remainder;
    }
    else {
      APInt(&local_70,LHS);
      operator-((llvm *)&local_90,&local_70);
      udivrem(&local_90,RHS,Quotient,Remainder);
      ~APInt(&local_90);
      ~APInt(&local_70);
      negate(Quotient);
      Quotient = Remainder;
    }
  }
  else {
    if (!bVar2) {
      udivrem(LHS,RHS,Quotient,Remainder);
      return;
    }
    APInt(&local_80,RHS);
    operator-((llvm *)&local_90,&local_80);
    udivrem(LHS,&local_90,Quotient,Remainder);
    ~APInt(&local_90);
    ~APInt(&local_80);
  }
  negate(Quotient);
  return;
}

Assistant:

void APInt::sdivrem(const APInt &LHS, const APInt &RHS,
                    APInt &Quotient, APInt &Remainder) {
  if (LHS.isNegative()) {
    if (RHS.isNegative())
      APInt::udivrem(-LHS, -RHS, Quotient, Remainder);
    else {
      APInt::udivrem(-LHS, RHS, Quotient, Remainder);
      Quotient.negate();
    }
    Remainder.negate();
  } else if (RHS.isNegative()) {
    APInt::udivrem(LHS, -RHS, Quotient, Remainder);
    Quotient.negate();
  } else {
    APInt::udivrem(LHS, RHS, Quotient, Remainder);
  }
}